

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall
Buffer_add_reference_callback_reached_after_ownership_changed_Test::TestBody
          (Buffer_add_reference_callback_reached_after_ownership_changed_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  bfy_iovec io;
  bfy_buffer tgt;
  bfy_buffer src;
  AssertHelper local_158;
  AssertHelper local_150;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  AssertHelperData *local_138;
  unsigned_long uStack_130;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  bfy_buffer local_a0;
  
  bfy_buffer_init();
  local_138 = (AssertHelperData *)0x0;
  uStack_130 = 0;
  local_148._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_148._M_head_impl._4_4_ << 0x20);
  local_158.data_._0_4_ =
       bfy_buffer_add_reference
                 (&local_a0,"Lorem ipsum dolor sit amet",0x1a,
                  TestBody::anon_class_1_0_00000001::__invoke,&local_138);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_128,"0",
             "bfy_buffer_add_reference(&src, std::data(str), std::size(str), cb, &io)",
             (int *)&local_148,(int *)&local_158);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x481,pcVar1);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  local_148._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a;
  local_158.data_ = (AssertHelperData *)bfy_buffer_get_content_len(&local_a0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_128,"std::size(str)","bfy_buffer_get_content_len(&src)",
             (unsigned_long *)&local_148,(unsigned_long *)&local_158);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x482,pcVar1);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  bfy_buffer_init();
  bfy_buffer_add_buffer((bfy_buffer *)local_128,&local_a0);
  local_150.data_ = (AssertHelperData *)((ulong)local_150.data_._4_4_ << 0x20);
  local_158.data_ = (AssertHelperData *)bfy_buffer_get_content_len(&local_a0);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_148,"0","bfy_buffer_get_content_len(&src)",(int *)&local_150,
             (unsigned_long *)&local_158);
  if (local_148._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x487,pcVar1);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158.data_ + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_158.data_ = (AssertHelperData *)&DAT_0000001a;
  local_150.data_ = (AssertHelperData *)bfy_buffer_get_content_len((bfy_buffer *)local_128);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_148,"std::size(str)","bfy_buffer_get_content_len(&tgt)",
             (unsigned_long *)&local_158,(unsigned_long *)&local_150);
  if (local_148._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x488,pcVar1);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158.data_ + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  bfy_buffer_destruct(&local_a0);
  local_158.data_ = local_158.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_148,"0","io.iov_len",(int *)&local_158,&uStack_130);
  if (local_148._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x48c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158.data_ + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_158.data_ = local_138;
  local_150.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<void*,void*>
            ((internal *)&local_148,"nullptr","io.iov_base",&local_150.data_,&local_158.data_);
  if (local_148._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x48d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158.data_ + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  bfy_buffer_destruct((bfy_buffer *)local_128);
  local_158.data_ = (AssertHelperData *)&DAT_0000001a;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_148,"std::size(str)","io.iov_len",(unsigned_long *)&local_158,
             &uStack_130);
  if (local_148._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x492,pcVar1);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158.data_ + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_158.data_ = (AssertHelperData *)0x1607d1;
  testing::internal::CmpHelperEQ<char_const*,void*>
            ((internal *)&local_148,"std::data(str)","io.iov_base",(char **)&local_158,&local_138);
  if (local_148._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x493,pcVar1);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158.data_ + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  return;
}

Assistant:

TEST(Buffer, add_reference_callback_reached_after_ownership_changed) {
    auto cb = [](void* data, size_t len, void* vdata) {
        auto* iop = reinterpret_cast<bfy_iovec*>(vdata);
        iop->iov_base = data;
        iop->iov_len = len;
    };

    // setup: add the reference to one buffer
    auto src = bfy_buffer_init();
    auto constexpr str = std::string_view { "Lorem ipsum dolor sit amet" };
    auto io = bfy_iovec {};
    EXPECT_EQ(0, bfy_buffer_add_reference(&src, std::data(str), std::size(str), cb, &io));
    EXPECT_EQ(std::size(str), bfy_buffer_get_content_len(&src));

    // transfer the contents to another buffer
    auto tgt = bfy_buffer_init();
    bfy_buffer_add_buffer(&tgt, &src);
    EXPECT_EQ(0, bfy_buffer_get_content_len(&src));
    EXPECT_EQ(std::size(str), bfy_buffer_get_content_len(&tgt));

    // confirm that destroying the src buffer does not invoke the unref function
    bfy_buffer_destruct(&src);
    EXPECT_EQ(0, io.iov_len);
    EXPECT_EQ(nullptr, io.iov_base);

    // confirm that destroying the tgt buffer *does* invoke the callback
    // since that is who owns the reference now
    bfy_buffer_destruct(&tgt);
    EXPECT_EQ(std::size(str), io.iov_len);
    EXPECT_EQ(std::data(str), io.iov_base);
}